

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.cpp
# Opt level: O0

int mbedtls_pk_sign_ext(mbedtls_pk_type_t pk_type,mbedtls_pk_context *ctx,mbedtls_md_type_t md_alg,
                       uchar *hash,size_t hash_len,uchar *sig,size_t sig_size,size_t *sig_len,
                       _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  size_t in_RCX;
  undefined4 in_EDX;
  long *in_RSI;
  int in_EDI;
  uchar *in_R8;
  size_t in_R9;
  size_t *in_stack_00000010;
  mbedtls_pk_context *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (*in_RSI == 0) {
    iVar1 = -16000;
  }
  else {
    iVar1 = mbedtls_pk_can_do(in_stack_ffffffffffffffb8,MBEDTLS_PK_NONE);
    if (iVar1 == 0) {
      iVar1 = -0x3f00;
    }
    else if (in_EDI == 6) {
      iVar1 = -0x3980;
    }
    else {
      iVar1 = mbedtls_pk_sign((mbedtls_pk_context *)CONCAT44(in_stack_fffffffffffffffc,in_EDI),
                              (mbedtls_md_type_t)((ulong)in_RSI >> 0x20),
                              (uchar *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_RCX,in_R8,in_R9
                              ,in_stack_00000010,(_func_int_void_ptr_uchar_ptr_size_t *)sig,
                              (void *)hash_len);
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_pk_sign_ext(mbedtls_pk_type_t pk_type,
                        mbedtls_pk_context *ctx,
                        mbedtls_md_type_t md_alg,
                        const unsigned char *hash, size_t hash_len,
                        unsigned char *sig, size_t sig_size, size_t *sig_len,
                        int (*f_rng)(void *, unsigned char *, size_t),
                        void *p_rng)
{
    if (ctx->pk_info == NULL) {
        return MBEDTLS_ERR_PK_BAD_INPUT_DATA;
    }

    if (!mbedtls_pk_can_do(ctx, pk_type)) {
        return MBEDTLS_ERR_PK_TYPE_MISMATCH;
    }

    if (pk_type != MBEDTLS_PK_RSASSA_PSS) {
        return mbedtls_pk_sign(ctx, md_alg, hash, hash_len,
                               sig, sig_size, sig_len, f_rng, p_rng);
    }

#if defined(MBEDTLS_RSA_C) && defined(MBEDTLS_PKCS1_V21)

#if defined(MBEDTLS_USE_PSA_CRYPTO)
    const psa_algorithm_t psa_md_alg = mbedtls_md_psa_alg_from_type(md_alg);
    if (psa_md_alg == 0) {
        return MBEDTLS_ERR_PK_BAD_INPUT_DATA;
    }

    if (mbedtls_pk_get_type(ctx) == MBEDTLS_PK_OPAQUE) {
        psa_status_t status;

        /* PSA_ALG_RSA_PSS() behaves the same as PSA_ALG_RSA_PSS_ANY_SALT() when
         * performing a signature, but they are encoded differently. Instead of
         * extracting the proper one from the wrapped key policy, just try both. */
        status = psa_sign_hash(ctx->priv_id, PSA_ALG_RSA_PSS(psa_md_alg),
                               hash, hash_len,
                               sig, sig_size, sig_len);
        if (status == PSA_ERROR_NOT_PERMITTED) {
            status = psa_sign_hash(ctx->priv_id, PSA_ALG_RSA_PSS_ANY_SALT(psa_md_alg),
                                   hash, hash_len,
                                   sig, sig_size, sig_len);
        }
        return PSA_PK_RSA_TO_MBEDTLS_ERR(status);
    }

    return mbedtls_pk_psa_rsa_sign_ext(PSA_ALG_RSA_PSS(psa_md_alg),
                                       ctx->pk_ctx, hash, hash_len,
                                       sig, sig_size, sig_len);
#else /* MBEDTLS_USE_PSA_CRYPTO */

    if (sig_size < mbedtls_pk_get_len(ctx)) {
        return MBEDTLS_ERR_PK_BUFFER_TOO_SMALL;
    }

    if (pk_hashlen_helper(md_alg, &hash_len) != 0) {
        return MBEDTLS_ERR_PK_BAD_INPUT_DATA;
    }

    mbedtls_rsa_context *const rsa_ctx = mbedtls_pk_rsa(*ctx);

    const int ret = mbedtls_rsa_rsassa_pss_sign_no_mode_check(rsa_ctx, f_rng, p_rng, md_alg,
                                                              (unsigned int) hash_len, hash, sig);
    if (ret == 0) {
        *sig_len = rsa_ctx->len;
    }
    return ret;

#endif /* MBEDTLS_USE_PSA_CRYPTO */

#else
    return MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE;
#endif /* MBEDTLS_RSA_C && MBEDTLS_PKCS1_V21 */
}